

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O0

void __thiscall FNodeBuilder::FixSplitSharers(FNodeBuilder *this,node_t *node)

{
  int iVar1;
  DWORD DVar2;
  uint uVar3;
  DWORD DVar4;
  DWORD DVar5;
  FSplitSharer *pFVar6;
  FPrivSeg *pFVar7;
  FEvent *pFVar8;
  bool bVar9;
  int endpartner;
  DWORD partner;
  DWORD newseg;
  FEvent *next;
  FEvent *event;
  uint local_20;
  int v2;
  DWORD seg;
  uint i;
  node_t *node_local;
  FNodeBuilder *this_local;
  
  v2 = 0;
  do {
    uVar3 = TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::Size
                      (&this->SplitSharers);
    if (uVar3 <= (uint)v2) {
      return;
    }
    pFVar6 = TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::operator[]
                       (&this->SplitSharers,(ulong)(uint)v2);
    local_20 = pFVar6->Seg;
    pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_20);
    iVar1 = pFVar7->v2;
    pFVar6 = TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::operator[]
                       (&this->SplitSharers,(ulong)(uint)v2);
    pFVar8 = FEventTree::FindEvent(&this->Events,pFVar6->Distance);
    if (pFVar8 != (FEvent *)0x0) {
      pFVar6 = TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::operator[]
                         (&this->SplitSharers,(ulong)(uint)v2);
      if ((pFVar6->Forward & 1U) == 0) {
        next = FEventTree::GetPredecessor(&this->Events,pFVar8);
        if (next != (FEvent *)0x0) {
          _partner = FEventTree::GetPredecessor(&this->Events,next);
          goto LAB_005fc570;
        }
      }
      else {
        next = FEventTree::GetSuccessor(&this->Events,pFVar8);
        if (next != (FEvent *)0x0) {
          _partner = FEventTree::GetSuccessor(&this->Events,next);
LAB_005fc570:
          while( true ) {
            pFVar8 = _partner;
            bVar9 = false;
            if ((next != (FEvent *)0x0) && (bVar9 = false, _partner != (FEvent *)0x0)) {
              bVar9 = (next->Info).Vertex != iVar1;
            }
            if (!bVar9) break;
            DVar4 = SplitSeg(this,local_20,(next->Info).Vertex,1);
            pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                               (&this->Segs,(ulong)local_20);
            DVar2 = pFVar7->next;
            pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                               (&this->Segs,(ulong)DVar4);
            pFVar7->next = DVar2;
            pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                               (&this->Segs,(ulong)local_20);
            pFVar7->next = DVar4;
            pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                               (&this->Segs,(ulong)local_20);
            uVar3 = pFVar7->partner;
            if (uVar3 != 0xffffffff) {
              DVar5 = SplitSeg(this,uVar3,(next->Info).Vertex,1);
              pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                                 (&this->Segs,(ulong)uVar3);
              DVar2 = pFVar7->next;
              pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                                 (&this->Segs,(long)(int)DVar5);
              pFVar7->next = DVar2;
              pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                                 (&this->Segs,(ulong)uVar3);
              pFVar7->next = DVar5;
              pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                                 (&this->Segs,(ulong)local_20);
              pFVar7->partner = DVar5;
              pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                                 (&this->Segs,(ulong)uVar3);
              pFVar7->partner = DVar4;
            }
            pFVar6 = TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::operator[]
                               (&this->SplitSharers,(ulong)(uint)v2);
            if ((pFVar6->Forward & 1U) == 0) {
              _partner = FEventTree::GetPredecessor(&this->Events,_partner);
            }
            else {
              _partner = FEventTree::GetSuccessor(&this->Events,_partner);
            }
            next = pFVar8;
            local_20 = DVar4;
          }
        }
      }
    }
    v2 = v2 + 1;
  } while( true );
}

Assistant:

void FNodeBuilder::FixSplitSharers (const node_t &node)
{
	D(Printf(PRINT_LOG, "events:\n"));
	D(Events.PrintTree());
	for (unsigned int i = 0; i < SplitSharers.Size(); ++i)
	{
		DWORD seg = SplitSharers[i].Seg;
		int v2 = Segs[seg].v2;
		FEvent *event = Events.FindEvent (SplitSharers[i].Distance);
		FEvent *next;

		if (event == NULL)
		{ // Should not happen
			continue;
		}

		// Use the CRT's printf so the formatting matches ZDBSP's
		D(char buff[200]);
		D(sprintf(buff, "Considering events on seg %d(%d[%d,%d]->%d[%d,%d]) [%g:%g]\n", seg,
			Segs[seg].v1,
			Vertices[Segs[seg].v1].x>>16,
			Vertices[Segs[seg].v1].y>>16,
			Segs[seg].v2,
			Vertices[Segs[seg].v2].x>>16,
			Vertices[Segs[seg].v2].y>>16,
			SplitSharers[i].Distance, event->Distance));
		D(Printf(PRINT_LOG, "%s", buff));

		if (SplitSharers[i].Forward)
		{
			event = Events.GetSuccessor (event);
			if (event == NULL)
			{
				continue;
			}
			next = Events.GetSuccessor (event);
		}
		else
		{
			event = Events.GetPredecessor (event);
			if (event == NULL)
			{
				continue;
			}
			next = Events.GetPredecessor (event);
		}

		while (event != NULL && next != NULL && event->Info.Vertex != v2)
		{
			D(Printf(PRINT_LOG, "Forced split of seg %d(%d->%d) at %d(%d,%d)\n", seg,
				Segs[seg].v1, Segs[seg].v2,
				event->Info.Vertex,
				Vertices[event->Info.Vertex].x>>16,
				Vertices[event->Info.Vertex].y>>16));

			DWORD newseg = SplitSeg (seg, event->Info.Vertex, 1);

			Segs[newseg].next = Segs[seg].next;
			Segs[seg].next = newseg;

			DWORD partner = Segs[seg].partner;
			if (partner != DWORD_MAX)
			{
				int endpartner = SplitSeg (partner, event->Info.Vertex, 1);

				Segs[endpartner].next = Segs[partner].next;
				Segs[partner].next = endpartner;

				Segs[seg].partner = endpartner;
				Segs[partner].partner = newseg;
			}

			seg = newseg;
			if (SplitSharers[i].Forward)
			{
				event = next;
				next = Events.GetSuccessor (next);
			}
			else
			{
				event = next;
				next = Events.GetPredecessor (next);
			}
		}
	}
}